

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::rehash(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
         *this,uint new_hash_size)

{
  uint uVar1;
  uint in_ESI;
  vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
  *in_RDI;
  node *pNode_end;
  node *pNode;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  new_map;
  hash_map_type *other;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  *in_stack_ffffffffffffff90;
  hash_map_type *this_00;
  undefined1 *puVar2;
  undefined4 in_stack_ffffffffffffffa0;
  hash_map_type *this_01;
  hash_map_type *local_48;
  undefined1 local_30 [16];
  int local_20;
  uint local_18;
  uint local_14;
  uint local_c;
  
  if ((in_RDI[1].m_size <= in_ESI) &&
     (local_c = in_ESI,
     uVar1 = vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
             ::size(in_RDI), in_ESI != uVar1)) {
    puVar2 = local_30;
    hash_map(in_stack_ffffffffffffff90);
    vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
    ::resize((vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
              *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),(uint)((ulong)puVar2 >> 0x20),
             SUB81((ulong)puVar2 >> 0x18,0));
    uVar1 = math::floor_log2i(local_c);
    local_20 = 0x20 - uVar1;
    local_14 = 0xffffffff;
    local_48 = (hash_map_type *)
               vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
               ::begin(in_RDI);
    other = local_48;
    this_00 = local_48;
    uVar1 = vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
            ::size(in_RDI);
    this_01 = other + uVar1;
    while ((local_48 != this_01 &&
           (((char)local_48->m_grow_threshold == '\0' ||
            (move_into(this_01,(node *)in_RDI), local_18 != in_RDI[1].m_size))))) {
      local_48 = local_48 + 1;
    }
    local_14 = local_c + 1 >> 1;
    vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
    ::clear_no_destruction(&this_00->m_values);
    *(undefined4 *)&in_RDI[1].m_p = 0x20;
    swap(this_00,other);
    ~hash_map(this_00);
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size) {
    CRNLIB_ASSERT(new_hash_size >= m_num_valid);
    CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

    if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
      return;

    hash_map new_map;
    new_map.m_values.resize(new_hash_size);
    new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
    CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
    new_map.m_grow_threshold = UINT_MAX;

    node* pNode = reinterpret_cast<node*>(m_values.begin());
    node* pNode_end = pNode + m_values.size();

    while (pNode != pNode_end) {
      if (pNode->state) {
        new_map.move_into(pNode);

        if (new_map.m_num_valid == m_num_valid)
          break;
      }

      pNode++;
    }

    new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

    m_values.clear_no_destruction();
    m_hash_shift = 32;

    swap(new_map);
  }